

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
::try_emplace_impl<int>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *this,int *k)

{
  iterator iter;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
  *res;
  tuple<int_&&> local_30;
  ctrl_t *local_28;
  anon_union_8_1_a8a14541_for_iterator_2 local_20;
  int *local_18;
  int *k_local;
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_local;
  
  local_18 = k;
  k_local = (int *)this;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::find_or_prepare_insert<int>
            (__return_storage_ptr__,
             &this->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
             ,k);
  if ((__return_storage_ptr__->second & 1U) != 0) {
    local_28 = (__return_storage_ptr__->first).ctrl_;
    local_20 = (anon_union_8_1_a8a14541_for_iterator_2)(__return_storage_ptr__->first).field_1.slot_
    ;
    std::forward_as_tuple<int>((int *)&local_30);
    std::forward_as_tuple<>();
    iter.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)
                   (anon_union_8_1_a8a14541_for_iterator_2)local_20.slot_;
    iter.ctrl_ = local_28;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>
                *)this,iter,(piecewise_construct_t *)&std::piecewise_construct,&local_30,
               (tuple<> *)((long)&res + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }